

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-utils.h
# Opt level: O3

void __thiscall wasm::LocalGetCounter::analyze(LocalGetCounter *this,Function *func,Expression *ast)

{
  pointer puVar1;
  size_t __new_size;
  Expression *local_20;
  Expression *ast_local;
  
  puVar1 = (this->num).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->num).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->num).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  local_20 = ast;
  __new_size = Function::getNumLocals(func);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->num,__new_size);
  Walker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>::walk
            ((Walker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_> *)this,
             &local_20);
  return;
}

Assistant:

void analyze(Function* func, Expression* ast) {
    num.clear();
    num.resize(func->getNumLocals());
    walk(ast);
  }